

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

BLOCK_SIZE av1_predict_max_partition(AV1_COMP *cpi,MACROBLOCK *x,float *features)

{
  float fVar1;
  uint uVar2;
  float *in_RDX;
  long in_RDI;
  double thresh;
  uint source_variance;
  BLOCK_SIZE sb_size;
  float probs [4];
  int i;
  float max_score;
  int result;
  NN_CONFIG *nn_config;
  float scores [4];
  undefined8 in_stack_ffffffffffffff78;
  buf_2d *in_stack_ffffffffffffff80;
  MACROBLOCKD *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  float *in_stack_ffffffffffffff98;
  float *in_stack_ffffffffffffffa0;
  int local_4c;
  float local_48;
  int local_44;
  float local_38 [6];
  float *local_20;
  long local_10;
  BLOCK_SIZE local_1;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  memset(local_38,0,0x10);
  (*av1_nn_predict)(local_20,&av1_max_part_pred_nn_config,1,local_38);
  local_44 = 3;
  if (*(char *)(local_10 + 0x60969) == '\x01') {
    local_44 = 0;
    local_48 = local_38[0];
    for (local_4c = 1; local_4c < 4; local_4c = local_4c + 1) {
      if (local_48 < local_38[local_4c]) {
        local_48 = local_38[local_4c];
        local_44 = local_4c;
      }
    }
    local_1 = get_block_size(local_44);
  }
  else {
    memset(&stack0xffffffffffffff98,0,0x10);
    av1_nn_softmax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    if (*(char *)(local_10 + 0x60969) == '\x02') {
      for (local_44 = 3; -1 < local_44; local_44 = local_44 + -1) {
        if (local_44 < 3) {
          *(float *)(&stack0xffffffffffffff98 + (long)local_44 * 4) =
               *(float *)(&stack0xffffffffffffff98 + (long)(local_44 + 1) * 4) +
               *(float *)(&stack0xffffffffffffff98 + (long)local_44 * 4);
        }
        if (0.2 < *(float *)(&stack0xffffffffffffff98 + (long)local_44 * 4)) break;
      }
    }
    else if ((*(char *)(local_10 + 0x60969) == '\x03') &&
            (uVar2 = av1_get_perpixel_variance_facade
                               ((AV1_COMP *)
                                CONCAT44(CONCAT13(*(undefined1 *)
                                                   (*(long *)(local_10 + 0x42008) + 0x1c),
                                                  (int3)in_stack_ffffffffffffff94),
                                         in_stack_ffffffffffffff90),in_stack_ffffffffffffff88,
                                in_stack_ffffffffffffff80,
                                (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff78 >> 0x38),
                                (int)in_stack_ffffffffffffff78), 0x10 < uVar2)) {
      fVar1 = 0.05;
      if (0x7f < uVar2) {
        fVar1 = 0.1;
      }
      for (local_44 = 3; -1 < local_44; local_44 = local_44 + -1) {
        if (local_44 < 3) {
          *(float *)(&stack0xffffffffffffff98 + (long)local_44 * 4) =
               *(float *)(&stack0xffffffffffffff98 + (long)(local_44 + 1) * 4) +
               *(float *)(&stack0xffffffffffffff98 + (long)local_44 * 4);
        }
        if (fVar1 < *(float *)(&stack0xffffffffffffff98 + (long)local_44 * 4)) break;
      }
    }
    local_1 = get_block_size(local_44);
  }
  return local_1;
}

Assistant:

BLOCK_SIZE av1_predict_max_partition(const AV1_COMP *const cpi,
                                     const MACROBLOCK *const x,
                                     const float *features) {
  float scores[MAX_NUM_CLASSES_MAX_MIN_PART_PRED] = { 0.0f };
  const NN_CONFIG *nn_config = &av1_max_part_pred_nn_config;

  assert(cpi->sf.part_sf.auto_max_partition_based_on_simple_motion !=
         NOT_IN_USE);

  av1_nn_predict(features, nn_config, 1, scores);

  int result = MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1;
  if (cpi->sf.part_sf.auto_max_partition_based_on_simple_motion ==
      DIRECT_PRED) {
    result = 0;
    float max_score = scores[0];
    for (int i = 1; i < MAX_NUM_CLASSES_MAX_MIN_PART_PRED; ++i) {
      if (scores[i] > max_score) {
        max_score = scores[i];
        result = i;
      }
    }
    return get_block_size(result);
  }

  float probs[MAX_NUM_CLASSES_MAX_MIN_PART_PRED] = { 0.0f };
  av1_nn_softmax(scores, probs, MAX_NUM_CLASSES_MAX_MIN_PART_PRED);

  if (cpi->sf.part_sf.auto_max_partition_based_on_simple_motion ==
      RELAXED_PRED) {
    for (result = MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1; result >= 0;
         --result) {
      if (result < MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1) {
        probs[result] += probs[result + 1];
      }
      if (probs[result] > 0.2) break;
    }
  } else if (cpi->sf.part_sf.auto_max_partition_based_on_simple_motion ==
             ADAPT_PRED) {
    const BLOCK_SIZE sb_size = cpi->common.seq_params->sb_size;
    // TODO(debargha): x->source_variance is unavailable at this point,
    // so compute. The redundant recomputation later can be removed.
    const unsigned int source_variance = av1_get_perpixel_variance_facade(
        cpi, &x->e_mbd, &x->plane[0].src, sb_size, AOM_PLANE_Y);
    if (source_variance > 16) {
      const double thresh = source_variance < 128 ? 0.05 : 0.1;
      for (result = MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1; result >= 0;
           --result) {
        if (result < MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1) {
          probs[result] += probs[result + 1];
        }
        if (probs[result] > thresh) break;
      }
    }
  }

  return get_block_size(result);
}